

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O2

void __thiscall
helics::CoreApp::CoreApp(CoreApp *this,CoreType ctype,string_view coreName,int argc,char **argv)

{
  ParseOutput PVar1;
  pointer *__ptr;
  _Head_base<0UL,_helics::helicsCLI11App_*,_false> local_48;
  int local_3c;
  _Alloc_hider local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = coreName._M_str;
  local_30._M_len = coreName._M_len;
  (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3c = argc;
  local_38._M_p = (pointer)argv;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->name,&local_30,(allocator<char> *)&local_48);
  generateParser((CoreApp *)&local_48);
  (local_48._M_head_impl)->coreType = ctype;
  PVar1 = helicsCLI11App::helics_parse<int&,char**&>
                    (local_48._M_head_impl,&local_3c,(char ***)&local_38);
  if (PVar1 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)&local_48);
  }
  if (local_48._M_head_impl != (helicsCLI11App *)0x0) {
    (*((local_48._M_head_impl)->super_App)._vptr_App[1])();
  }
  return;
}

Assistant:

CoreApp::CoreApp(CoreType ctype, std::string_view coreName, int argc, char* argv[]): name(coreName)
{
    auto app = generateParser();
    app->setDefaultCoreType(ctype);
    if (app->helics_parse(argc, argv) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}